

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int moveToLeftmost(BtCursor *pCur)

{
  uint uVar1;
  MemPage *pMVar2;
  int iVar3;
  Pgno pgno;
  
  do {
    pMVar2 = pCur->pPage;
    if (pMVar2->leaf != '\0') {
      return 0;
    }
    uVar1 = *(uint *)(pMVar2->aData +
                     (CONCAT11(pMVar2->aCellIdx[(ulong)pCur->ix * 2],
                               pMVar2->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar2->maskPage));
    iVar3 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

static int moveToLeftmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( rc==SQLITE_OK && !(pPage = pCur->pPage)->leaf ){
    assert( pCur->ix<pPage->nCell );
    pgno = get4byte(findCell(pPage, pCur->ix));
    rc = moveToChild(pCur, pgno);
  }
  return rc;
}